

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O2

void print_report(char *method,int *stats)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  
  printf("\n%s version %d.%d, %s: ",method,2,9,"Oct 10, 2014");
  if (stats == (int *)0x0) {
    pcVar4 = "No statistics available.";
    goto LAB_0010c4f1;
  }
  uVar1 = stats[4];
  uVar2 = stats[5];
  uVar3 = stats[6];
  pcVar4 = "ERROR.  ";
  if (-1 < stats[3]) {
    pcVar4 = "OK.  ";
  }
  printf(pcVar4);
  switch(stats[3]) {
  case 1:
    puts("Matrix has unsorted or duplicate row indices.");
    printf("%s: number of duplicate or out-of-order row indices: %d\n",method,(ulong)uVar3);
    printf("%s: last seen duplicate or out-of-order row index:   %d\n",method,(ulong)uVar2);
    printf("%s: last seen in column:                             %d",method,(ulong)uVar1);
  case 0:
    putchar(10);
    printf("%s: number of dense or empty rows ignored:           %d\n",method,(ulong)(uint)*stats);
    printf("%s: number of dense or empty columns ignored:        %d\n",method,(ulong)(uint)stats[1])
    ;
    printf("%s: number of garbage collections performed:         %d\n",method,(ulong)(uint)stats[2])
    ;
    return;
  case -10:
    pcVar4 = "Out of memory.";
    goto LAB_0010c4f1;
  case -9:
    printf("Row index (row %d) out of bounds (%d to %d) in column %d.\n",(ulong)uVar2,0,
           (ulong)(uVar3 - 1),(ulong)uVar1);
    return;
  case -8:
    pcVar4 = "Column %d has a negative number of nonzero entries (%d).\n";
    goto LAB_0010c5c4;
  case -7:
    puts("Array A too small.");
    pcVar4 = "        Need Alen >= %d, but given only Alen = %d.\n";
LAB_0010c5c4:
    printf(pcVar4,(ulong)uVar1,(ulong)uVar2);
    return;
  case -6:
    pcVar4 = "Invalid column pointer, p [0] = %d, must be zero.\n";
    break;
  case -5:
    pcVar4 = "Invalid number of nonzero entries (%d).\n";
    break;
  case -4:
    pcVar4 = "Invalid number of columns (%d).\n";
    break;
  case -3:
    pcVar4 = "Invalid number of rows (%d).\n";
    break;
  case -2:
    pcVar4 = "Array p (column pointers for matrix) not present.";
    goto LAB_0010c4f1;
  case -1:
    pcVar4 = "Array A (row indices of matrix) not present.";
LAB_0010c4f1:
    puts(pcVar4);
    return;
  default:
    return;
  }
  printf(pcVar4,(ulong)uVar1);
  return;
}

Assistant:

PRIVATE void print_report
(
    const char *method,
    Int stats [COLAMD_STATS]
)
{

    Int i1, i2, i3 ;

    SUITESPARSE_PRINTF ("\n%s version %d.%d, %s: ", method,
            COLAMD_MAIN_VERSION, COLAMD_SUB_VERSION, COLAMD_DATE) ;

    if (!stats)
    {
        SUITESPARSE_PRINTF ("No statistics available.\n") ;
	return ;
    }

    i1 = stats [COLAMD_INFO1] ;
    i2 = stats [COLAMD_INFO2] ;
    i3 = stats [COLAMD_INFO3] ;

    if (stats [COLAMD_STATUS] >= 0)
    {
        SUITESPARSE_PRINTF ("OK.  ") ;
    }
    else
    {
        SUITESPARSE_PRINTF ("ERROR.  ") ;
    }

    switch (stats [COLAMD_STATUS])
    {

	case COLAMD_OK_BUT_JUMBLED:

            SUITESPARSE_PRINTF(
                    "Matrix has unsorted or duplicate row indices.\n") ;

            SUITESPARSE_PRINTF(
                    "%s: number of duplicate or out-of-order row indices: %d\n",
                    method, i3) ;

            SUITESPARSE_PRINTF(
                    "%s: last seen duplicate or out-of-order row index:   %d\n",
                    method, INDEX (i2)) ;

            SUITESPARSE_PRINTF(
                    "%s: last seen in column:                             %d",
                    method, INDEX (i1)) ;

	    /* no break - fall through to next case instead */

	case COLAMD_OK:

            SUITESPARSE_PRINTF("\n") ;

            SUITESPARSE_PRINTF(
                    "%s: number of dense or empty rows ignored:           %d\n",
                    method, stats [COLAMD_DENSE_ROW]) ;

            SUITESPARSE_PRINTF(
                    "%s: number of dense or empty columns ignored:        %d\n",
                    method, stats [COLAMD_DENSE_COL]) ;

            SUITESPARSE_PRINTF(
                    "%s: number of garbage collections performed:         %d\n",
                    method, stats [COLAMD_DEFRAG_COUNT]) ;
	    break ;

	case COLAMD_ERROR_A_not_present:

	    SUITESPARSE_PRINTF(
                    "Array A (row indices of matrix) not present.\n") ;
	    break ;

	case COLAMD_ERROR_p_not_present:

            SUITESPARSE_PRINTF(
                    "Array p (column pointers for matrix) not present.\n") ;
	    break ;

	case COLAMD_ERROR_nrow_negative:

            SUITESPARSE_PRINTF("Invalid number of rows (%d).\n", i1) ;
	    break ;

	case COLAMD_ERROR_ncol_negative:

            SUITESPARSE_PRINTF("Invalid number of columns (%d).\n", i1) ;
	    break ;

	case COLAMD_ERROR_nnz_negative:

            SUITESPARSE_PRINTF(
                    "Invalid number of nonzero entries (%d).\n", i1) ;
	    break ;

	case COLAMD_ERROR_p0_nonzero:

            SUITESPARSE_PRINTF(
                    "Invalid column pointer, p [0] = %d, must be zero.\n", i1);
	    break ;

	case COLAMD_ERROR_A_too_small:

            SUITESPARSE_PRINTF("Array A too small.\n") ;
            SUITESPARSE_PRINTF(
                    "        Need Alen >= %d, but given only Alen = %d.\n",
                    i1, i2) ;
	    break ;

	case COLAMD_ERROR_col_length_negative:

            SUITESPARSE_PRINTF
            ("Column %d has a negative number of nonzero entries (%d).\n",
            INDEX (i1), i2) ;
	    break ;

	case COLAMD_ERROR_row_index_out_of_bounds:

            SUITESPARSE_PRINTF
            ("Row index (row %d) out of bounds (%d to %d) in column %d.\n",
            INDEX (i2), INDEX (0), INDEX (i3-1), INDEX (i1)) ;
	    break ;

	case COLAMD_ERROR_out_of_memory:

            SUITESPARSE_PRINTF("Out of memory.\n") ;
	    break ;

	/* v2.4: internal-error case deleted */
    }
}